

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

bool __thiscall depspawn::internal::arg_info::is_contained_array(arg_info *this,arg_info *other)

{
  char cVar1;
  int s1;
  int e1;
  int s2;
  bool bVar2;
  type *ptVar3;
  long *in_RSI;
  long *in_RDI;
  int lim;
  int i;
  int local_1c;
  long *local_18;
  
  cVar1 = *(char *)((long)in_RDI + 0x21);
  local_18 = in_RSI;
  do {
    for (local_1c = 0; local_1c < cVar1; local_1c = local_1c + 1) {
      ptVar3 = std::get<0ul,int,int>((pair<int,_int> *)0x129740);
      s1 = *ptVar3;
      ptVar3 = std::get<1ul,int,int>((pair<int,_int> *)0x129760);
      e1 = *ptVar3;
      ptVar3 = std::get<0ul,int,int>((pair<int,_int> *)0x129783);
      s2 = *ptVar3;
      ptVar3 = std::get<1ul,int,int>((pair<int,_int> *)0x1297a6);
      bVar2 = anon_unknown.dwarf_c859::contains_intervals<int>(s1,e1,s2,*ptVar3);
      if (!bVar2) break;
    }
    if (local_1c == cVar1) {
      return true;
    }
    local_18 = (long *)local_18[3];
    bVar2 = false;
    if (local_18 != (long *)0x0) {
      bVar2 = *in_RDI == *local_18;
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool arg_info::is_contained_array(const arg_info *other) const
    { int i;
      
      const int lim = rank;
      
      do {

          assert(lim == other->rank);
          
          for(i = 0; i < lim; i++) {
            if(!contains_intervals(std::get<0>(other->array_range[i]), std::get<1>(other->array_range[i]),
                                   std::get<0>(array_range[i]), std::get<1>(array_range[i])))
              break;
          }
          
          if(i == lim) {
            //if(depspawn::debug) std::cout << "DEP FOUND\n";
            return true;
          }

 
        other = other->next;

      } while(other && (addr == other->addr));
      
      return false;
    }